

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Check.cpp
# Opt level: O0

TestResult *
rc::detail::checkProperty
          (TestResult *__return_storage_ptr__,Property *property,TestMetadata *metadata,
          TestParams *params,TestListener *listener,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>_>
          *reproduceMap)

{
  bool bVar1;
  byte bVar2;
  pointer pvVar3;
  bool local_119;
  undefined1 local_f8 [8];
  Reproduce reproduce;
  SuccessResult success;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_true>
  local_40;
  const_iterator it;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>_>
  *reproduceMap_local;
  TestListener *listener_local;
  TestParams *params_local;
  TestMetadata *metadata_local;
  Property *property_local;
  
  it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_true>
               )reproduceMap;
  bVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>_>
          ::empty(reproduceMap);
  if (bVar1) {
    testProperty(__return_storage_ptr__,property,metadata,params,listener);
  }
  else {
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>_>
         ::find(it.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_true>
                ._M_cur,&metadata->id);
    bVar2 = std::__cxx11::string::empty();
    local_119 = true;
    if ((bVar2 & 1) == 0) {
      success.distribution._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::
                   end<std::unordered_map<std::__cxx11::string,rc::detail::Reproduce,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,rc::detail::Reproduce>>>>
                             ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>_>
                               *)it.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_true>
                                 ._M_cur);
      local_119 = std::__detail::operator==
                            (&local_40,
                             (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_true>
                              *)&success.distribution._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
    }
    if (local_119 == false) {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_false,_true>
                             *)&local_40);
      Reproduce::Reproduce((Reproduce *)local_f8,&pvVar3->second);
      if ((params->disableShrinking & 1U) != 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&reproduce.size);
      }
      reproduceProperty(__return_storage_ptr__,property,(Reproduce *)local_f8);
      Reproduce::~Reproduce((Reproduce *)local_f8);
    }
    else {
      SuccessResult::SuccessResult
                ((SuccessResult *)
                 &reproduce.shrinkPath.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      reproduce.shrinkPath.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      Variant<rc::detail::SuccessResult,rc::detail::FailureResult,rc::detail::GaveUpResult,rc::detail::Error>
      ::Variant<rc::detail::SuccessResult,void>
                ((Variant<rc::detail::SuccessResult,rc::detail::FailureResult,rc::detail::GaveUpResult,rc::detail::Error>
                  *)__return_storage_ptr__,
                 (SuccessResult *)
                 &reproduce.shrinkPath.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      SuccessResult::~SuccessResult
                ((SuccessResult *)
                 &reproduce.shrinkPath.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TestResult
checkProperty(const Property &property,
              const TestMetadata &metadata,
              const TestParams &params,
              TestListener &listener,
              const std::unordered_map<std::string, Reproduce> &reproduceMap) {
  if (reproduceMap.empty()) {
    return testProperty(property, metadata, params, listener);
  }

  const auto it = reproduceMap.find(metadata.id);
  if (metadata.id.empty() || (it == end(reproduceMap))) {
    SuccessResult success;
    success.numSuccess = 0;
    return success;
  } else {
    auto reproduce = it->second;
    if (params.disableShrinking) {
      reproduce.shrinkPath.clear();
    }
    return reproduceProperty(property, reproduce);
  }
}